

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_free_svc_cyclic_refresh(AV1_COMP *cpi)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  LAYER_CONTEXT *lc;
  int layer;
  int tl;
  int sl;
  SVC *svc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x9d338); local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x9d33c); local_18 = local_18 + 1) {
      iVar2 = local_14 * *(int *)(in_RDI + 0x9d33c) + local_18;
      lVar1 = *(long *)(in_RDI + 0x9d488);
      aom_free((void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
      *(undefined8 *)(lVar1 + (long)iVar2 * 0x3380 + 0x3360) = 0;
    }
  }
  return;
}

Assistant:

void av1_free_svc_cyclic_refresh(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      aom_free(lc->map);
      lc->map = NULL;
    }
  }
}